

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

void __thiscall wasm::Literal::Literal(Literal *this,Type type)

{
  uint uVar1;
  bool bVar2;
  BasicType BVar3;
  char *pcVar4;
  HeapType local_28;
  Type local_20;
  Type type_local;
  
  (this->type).id = type.id;
  local_20.id = type.id;
  if (type.id < 7) {
    BVar3 = wasm::Type::getBasic(&local_20);
    switch(BVar3) {
    case none:
    case unreachable:
      pcVar4 = "Invalid literal type";
      uVar1 = 0x32;
      goto LAB_00c92c1e;
    case i32:
    case f32:
      goto switchD_00c92b46_caseD_2;
    case i64:
    case f64:
      (this->field_0).i64 = 0;
      return;
    case v128:
      goto switchD_00c92b46_caseD_6;
    }
  }
  bVar2 = wasm::Type::isNull(&local_20);
  if (bVar2) {
    if (((6 < local_20.id) && (((uint)local_20.id & 3) == 2)) &&
       (bVar2 = wasm::Type::isExact(&local_20), !bVar2)) {
switchD_00c92b46_caseD_6:
      (this->field_0).i64 = 0;
      (this->field_0).func.super_IString.str._M_str = (char *)0x0;
      return;
    }
    pcVar4 = "type.isNullable() && !type.isExact()";
    uVar1 = 0x38;
LAB_00c92c08:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,uVar1,"wasm::Literal::Literal(Type)");
  }
  if ((6 < local_20.id) && ((local_20.id & 1) == 0)) {
    local_28 = wasm::Type::getHeapType(&local_20);
    bVar2 = HeapType::isMaybeShared(&local_28,i31);
    if (bVar2) {
      if ((6 < local_20.id) && ((local_20.id & 3) == 0)) {
switchD_00c92b46_caseD_2:
        (this->field_0).i32 = 0;
        return;
      }
      pcVar4 = "type.isNonNullable()";
      uVar1 = 0x3e;
      goto LAB_00c92c08;
    }
  }
  pcVar4 = "Unexpected literal type";
  uVar1 = 0x43;
LAB_00c92c1e:
  handle_unreachable(pcVar4,
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                     ,uVar1);
}

Assistant:

Literal::Literal(Type type) : type(type) {
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::i32:
      case Type::f32:
        i32 = 0;
        return;
      case Type::i64:
      case Type::f64:
        i64 = 0;
        return;
      case Type::v128:
        memset(&v128, 0, 16);
        return;
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("Invalid literal type");
        return;
    }
  }

  if (type.isNull()) {
    assert(type.isNullable() && !type.isExact());
    new (&gcData) std::shared_ptr<GCData>();
    return;
  }

  if (type.isRef() && type.getHeapType().isMaybeShared(HeapType::i31)) {
    assert(type.isNonNullable());
    i32 = 0;
    return;
  }

  WASM_UNREACHABLE("Unexpected literal type");
}